

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

bool __thiscall
Assimp::AMFImporter::Find_NodeElement
          (AMFImporter *this,string *pID,EType pType,CAMFImporter_NodeElement **pNodeElement)

{
  pointer __s2;
  size_t __n;
  CAMFImporter_NodeElement *pCVar1;
  int iVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (this->mNodeElement_List).
           super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&this->mNodeElement_List) {
    __s2 = (pID->_M_dataplus)._M_p;
    __n = pID->_M_string_length;
    do {
      pCVar1 = (CAMFImporter_NodeElement *)p_Var3[1]._M_next;
      if (((pCVar1->ID)._M_string_length == __n) &&
         (((__n == 0 || (iVar2 = bcmp((pCVar1->ID)._M_dataplus._M_p,__s2,__n), iVar2 == 0)) &&
          (pCVar1->Type == pType)))) {
        if (pNodeElement == (CAMFImporter_NodeElement **)0x0) {
          return true;
        }
        *pNodeElement = pCVar1;
        return true;
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->mNodeElement_List);
  }
  return false;
}

Assistant:

bool AMFImporter::Find_NodeElement(const std::string& pID, const CAMFImporter_NodeElement::EType pType, CAMFImporter_NodeElement** pNodeElement) const
{
	for(CAMFImporter_NodeElement* ne: mNodeElement_List)
	{
		if((ne->ID == pID) && (ne->Type == pType))
		{
			if(pNodeElement != nullptr) *pNodeElement = ne;

			return true;
		}
	}// for(CAMFImporter_NodeElement* ne: mNodeElement_List)

	return false;
}